

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csr.c
# Opt level: O0

int riscv_csrrw_riscv32(CPURISCVState_conflict *env,int csrno,target_ulong_conflict *ret_value,
                       target_ulong_conflict new_value,target_ulong_conflict write_mask)

{
  _Bool _Var1;
  uint uVar2;
  int iVar3;
  ArchCPU_conflict20 *pAVar4;
  uint local_44;
  int read_only;
  int effective_priv;
  RISCVCPU *cpu;
  target_ulong_conflict old_value;
  int ret;
  target_ulong_conflict write_mask_local;
  target_ulong_conflict new_value_local;
  target_ulong_conflict *ret_value_local;
  CPURISCVState_conflict *pCStack_18;
  int csrno_local;
  CPURISCVState_conflict *env_local;
  
  old_value = write_mask;
  ret = new_value;
  _write_mask_local = ret_value;
  ret_value_local._4_4_ = csrno;
  pCStack_18 = env;
  pAVar4 = env_archcpu(env);
  local_44 = pCStack_18->priv;
  uVar2 = ret_value_local._4_4_ & 0xc00;
  iVar3 = riscv_has_ext(pCStack_18,0x80);
  if (((iVar3 != 0) && (pCStack_18->priv == 1)) &&
     (_Var1 = riscv_cpu_virt_enabled_riscv32(pCStack_18), !_Var1)) {
    local_44 = local_44 + 1;
  }
  if (((old_value == 0) || (uVar2 != 0xc00)) &&
     (((pCStack_18->debugger & 1U) != 0 || ((ret_value_local._4_4_ & 0x300) >> 8 <= local_44)))) {
    if (((pAVar4->cfg).ext_icsr & 1U) == 0) {
      env_local._4_4_ = -1;
    }
    else if ((csr_ops[(int)ret_value_local._4_4_].predicate == (riscv_csr_predicate_fn)0x0) ||
            (iVar3 = (*csr_ops[(int)ret_value_local._4_4_].predicate)
                               (pCStack_18,ret_value_local._4_4_), iVar3 < 0)) {
      env_local._4_4_ = -1;
    }
    else if (csr_ops[(int)ret_value_local._4_4_].op == (riscv_csr_op_fn)0x0) {
      if (csr_ops[(int)ret_value_local._4_4_].read == (riscv_csr_read_fn)0x0) {
        env_local._4_4_ = -1;
      }
      else {
        cpu._4_4_ = (*csr_ops[(int)ret_value_local._4_4_].read)
                              (pCStack_18,ret_value_local._4_4_,(target_ulong_conflict *)&cpu);
        env_local._4_4_ = cpu._4_4_;
        if ((-1 < cpu._4_4_) &&
           (((old_value == 0 ||
             (ret = (uint)cpu & (old_value ^ 0xffffffff) | ret & old_value,
             csr_ops[(int)ret_value_local._4_4_].write == (riscv_csr_write_fn)0x0)) ||
            (env_local._4_4_ =
                  (*csr_ops[(int)ret_value_local._4_4_].write)(pCStack_18,ret_value_local._4_4_,ret)
            , -1 < env_local._4_4_)))) {
          if (_write_mask_local != (uint *)0x0) {
            *_write_mask_local = (uint)cpu;
          }
          env_local._4_4_ = 0;
        }
      }
    }
    else {
      env_local._4_4_ =
           (*csr_ops[(int)ret_value_local._4_4_].op)
                     (pCStack_18,ret_value_local._4_4_,_write_mask_local,ret,old_value);
    }
  }
  else {
    env_local._4_4_ = -1;
  }
  return env_local._4_4_;
}

Assistant:

int riscv_csrrw(CPURISCVState *env, int csrno, target_ulong *ret_value,
                target_ulong new_value, target_ulong write_mask)
{
    int ret;
    target_ulong old_value;
    RISCVCPU *cpu = env_archcpu(env);

    /* check privileges and return -1 if check fails */
    int effective_priv = env->priv;
    int read_only = get_field(csrno, 0xC00) == 3;

    if (riscv_has_ext(env, RVH) &&
        env->priv == PRV_S &&
        !riscv_cpu_virt_enabled(env)) {
        /*
         * We are in S mode without virtualisation, therefore we are in HS Mode.
         * Add 1 to the effective privledge level to allow us to access the
         * Hypervisor CSRs.
         */
        effective_priv++;
    }

    if ((write_mask && read_only) ||
        (!env->debugger && (effective_priv < get_field(csrno, 0x300)))) {
        return -1;
    }

    /* ensure the CSR extension is enabled. */
    if (!cpu->cfg.ext_icsr) {
        return -1;
    }

    /* check predicate */
    if (!csr_ops[csrno].predicate || csr_ops[csrno].predicate(env, csrno) < 0) {
        return -1;
    }

    /* execute combined read/write operation if it exists */
    if (csr_ops[csrno].op) {
        return csr_ops[csrno].op(env, csrno, ret_value, new_value, write_mask);
    }

    /* if no accessor exists then return failure */
    if (!csr_ops[csrno].read) {
        return -1;
    }

    /* read old value */
    ret = csr_ops[csrno].read(env, csrno, &old_value);
    if (ret < 0) {
        return ret;
    }

    /* write value if writable and write mask set, otherwise drop writes */
    if (write_mask) {
        new_value = (old_value & ~write_mask) | (new_value & write_mask);
        if (csr_ops[csrno].write) {
            ret = csr_ops[csrno].write(env, csrno, new_value);
            if (ret < 0) {
                return ret;
            }
        }
    }

    /* return old value */
    if (ret_value) {
        *ret_value = old_value;
    }

    return 0;
}